

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoLinear>::HDivDirections
          (TPZGeoElRefLess<pzgeom::TPZGeoLinear> *this,TPZVec<double> *pt,
          TPZFMatrix<Fad<double>_> *directions)

{
  long lVar1;
  Fad<double> *pFVar2;
  TPZFNMatrix<9,_double> gradxinv;
  TPZFNMatrix<9,_double> gradx;
  TPZManVector<Fad<double>,_10> qsiFad;
  TPZFMatrix<double> local_520;
  double local_490 [10];
  TPZFMatrix<double> local_440;
  double local_3b0 [10];
  undefined1 local_360 [12];
  uint uStack_354;
  double *pdStack_350;
  double dStack_348;
  Fad<double> *local_340;
  Fad<double> *local_338;
  int64_t local_330;
  TPZVec<int> local_328;
  int local_308 [6];
  undefined **local_2f0;
  Fad<double> *local_2e8;
  int64_t iStack_2e0;
  int64_t local_2d8;
  Fad<double> local_2d0 [10];
  TPZManVector<Fad<double>,_10> local_190;
  
  local_440.fElem = local_3b0;
  local_440.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_440.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_440.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_440.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_440.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_440.fSize = 9;
  local_440.fGiven = local_440.fElem;
  TPZVec<int>::TPZVec(&local_440.fPivot.super_TPZVec<int>,0);
  local_440.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_440.fPivot.super_TPZVec<int>.fStore = local_440.fPivot.fExtAlloc;
  local_440.fPivot.super_TPZVec<int>.fNElements = 0;
  local_440.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_440.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_440.fWork.fStore = (double *)0x0;
  local_440.fWork.fNElements = 0;
  local_440.fWork.fNAlloc = 0;
  local_440.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  TPZFMatrix<double>::operator=(&local_440,0.0);
  local_520.fElem = local_490;
  local_520.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
  local_520.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_520.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_520.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_520.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_520.fSize = 9;
  local_520.fGiven = local_520.fElem;
  TPZVec<int>::TPZVec(&local_520.fPivot.super_TPZVec<int>,0);
  local_520.fPivot.super_TPZVec<int>.fStore = local_520.fPivot.fExtAlloc;
  local_520.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_520.fPivot.super_TPZVec<int>.fNElements = 0;
  local_520.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_520.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_520.fWork.fStore = (double *)0x0;
  local_520.fWork.fNElements = 0;
  local_520.fWork.fNAlloc = 0;
  local_520.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  TPZFMatrix<double>::operator=(&local_520,0.0);
  (**(code **)(*(long *)&this->super_TPZGeoEl + 0x230))(this,pt,&local_440);
  TPZFMatrix<double>::Resize(&local_440,1,1);
  TPZMatrix<double>::Inverse(&local_440.super_TPZMatrix<double>,&local_520,ENoDecompose);
  local_360._0_8_ = (_func_int **)0x0;
  stack0xfffffffffffffca8 = (ulong)uStack_354 << 0x20;
  pdStack_350 = (double *)0x0;
  dStack_348 = 0.0;
  TPZManVector<Fad<double>,_10>::TPZManVector(&local_190,1,(Fad<double> *)local_360);
  Fad<double>::~Fad((Fad<double> *)local_360);
  Fad<double>::Fad((Fad<double> *)local_360,1,pt->fStore);
  pFVar2 = local_190.super_TPZVec<Fad<double>_>.fStore;
  (local_190.super_TPZVec<Fad<double>_>.fStore)->val_ = (double)local_360._0_8_;
  Vector<double>::operator=
            (&(local_190.super_TPZVec<Fad<double>_>.fStore)->dx_,(Vector<double> *)(local_360 + 8));
  pFVar2->defaultVal = dStack_348;
  Fad<double>::~Fad((Fad<double> *)local_360);
  if ((0 < local_520.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow) &&
     (0 < local_520.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol)) {
    *((local_190.super_TPZVec<Fad<double>_>.fStore)->dx_).ptr_to_data = *local_520.fElem;
    pFVar2 = local_2d0;
    stack0xfffffffffffffca8 = 3;
    pdStack_350 = (double *)0x1;
    dStack_348 = (double)((ulong)dStack_348 & 0xffffffffffff0000);
    local_360._0_8_ = &PTR__TPZFMatrix_018773e8;
    local_330 = 9;
    local_340 = pFVar2;
    local_338 = pFVar2;
    TPZVec<int>::TPZVec(&local_328,0);
    local_328.fStore = local_308;
    local_328._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_328.fNElements = 0;
    local_328.fNAlloc = 0;
    local_2f0 = &PTR__TPZVec_01846938;
    local_2e8 = (Fad<double> *)0x0;
    iStack_2e0 = 0;
    local_2d8 = 0;
    local_360._0_8_ = &PTR__TPZFNMatrix_018770f8;
    lVar1 = 0;
    do {
      Fad<double>::Fad(pFVar2);
      lVar1 = lVar1 + -0x20;
      pFVar2 = pFVar2 + 1;
    } while (lVar1 != -0x140);
    (**(code **)(*(long *)&this->super_TPZGeoEl + 0x240))(this,&local_190,local_360);
    pztopology::TPZLine::ComputeHDivDirections<Fad<double>>
              ((TPZFMatrix<Fad<double>_> *)local_360,directions);
    local_360._0_8_ = &PTR__TPZFNMatrix_018770f8;
    lVar1 = 0x1b0;
    do {
      Fad<double>::~Fad((Fad<double> *)(local_360 + lVar1));
      lVar1 = lVar1 + -0x20;
    } while (lVar1 != 0x70);
    TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)local_360,&PTR_PTR_018773b0);
    TPZManVector<Fad<double>,_10>::~TPZManVector(&local_190);
    TPZFMatrix<double>::~TPZFMatrix(&local_520,&PTR_PTR_0183dba8);
    TPZFMatrix<double>::~TPZFMatrix(&local_440,&PTR_PTR_0183dba8);
    return;
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZGeoElRefLess<TGeo>::HDivDirections(TPZVec<REAL> &pt, TPZFMatrix<Fad<REAL>> &directions)
{
    TPZFNMatrix<9,REAL> gradx(3,TGeo::Dimension,0.),gradxinv(TGeo::Dimension,TGeo::Dimension,0.);
    
    this->GradX(pt, gradx);
    gradx.Resize(TGeo::Dimension,TGeo::Dimension);
    gradx.Inverse(gradxinv, ENoDecompose);
    
    TPZManVector<Fad<REAL>> qsiFad(TGeo::Dimension,0.);
    
    for(int i=0;i<TGeo::Dimension;i++){
        qsiFad[i] = Fad<REAL>(TGeo::Dimension,pt[i]);

        for(int j=0;j<TGeo::Dimension;j++){
            qsiFad[i].fastAccessDx(j)=gradxinv(i,j);
        }
    }
    //std::cout<<qsiFad<<std::endl;
    TPZFNMatrix<9,Fad<REAL>> gradxFad(3,TGeo::Dimension);
    this->GradX(qsiFad, gradxFad);
    //gradxFad.Print(std::cout);
    TGeo::ComputeHDivDirections(gradxFad, directions);
   
}